

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_fmax_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_00;
  int32_t *piVar1;
  uint uVar2;
  int iVar3;
  float32 fVar4;
  uint uVar5;
  float32 fVar6;
  float32 fVar7;
  fpr_t *pfVar8;
  ulong b;
  ulong uVar9;
  fpr_t *pfVar10;
  float64 fVar11;
  float_status *status;
  float64 fVar12;
  uintptr_t unaff_retaddr;
  
  status_00 = &(env->active_tc).msa_fp_status;
  pfVar8 = (env->active_fpu).fpr + ws;
  pfVar10 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    uVar9 = pfVar8->fd;
    if ((pfVar8->fd & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      iVar3 = float64_is_quiet_nan_mips(pfVar10->fd,status_00);
      b = pfVar8->fd;
      uVar9 = b;
      if (iVar3 == 0) goto LAB_006d4e7f;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
    else {
LAB_006d4e7f:
      b = pfVar10->fd;
      if ((b & 0x7fffffffffffffff) < 0x7ff0000000000001) {
        iVar3 = float64_is_quiet_nan_mips(uVar9,status_00);
        if (iVar3 != 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          b = pfVar10->fd;
          uVar9 = b;
          goto LAB_006d4eb9;
        }
        uVar9 = pfVar8->fd;
        b = pfVar10->fd;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
LAB_006d4eb9:
    fVar12 = float64_max_mips(uVar9,b,status_00);
    uVar5 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
      fVar12 = float64_default_nan_mips(status_00);
      fVar12 = (long)(int)uVar5 | fVar12 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    fVar11 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    if ((fVar11 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      iVar3 = float64_is_quiet_nan_mips
                        (*(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),status_00)
      ;
      uVar9 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      fVar11 = uVar9;
      if (iVar3 == 0) goto LAB_006d4f4c;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
    else {
LAB_006d4f4c:
      uVar9 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      if ((uVar9 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
        iVar3 = float64_is_quiet_nan_mips(fVar11,status_00);
        if (iVar3 != 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          uVar9 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
          fVar11 = uVar9;
          goto LAB_006d4f86;
        }
        fVar11 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
        uVar9 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
LAB_006d4f86:
    fVar11 = float64_max_mips(fVar11,uVar9,status_00);
    uVar5 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
      fVar11 = float64_default_nan_mips(status_00);
      fVar11 = (long)(int)uVar5 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    goto LAB_006d5273;
  }
  if (df != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1abd,
                  "void helper_msa_fmax_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar5 = pfVar8->fs[0];
  if ((uVar5 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips(pfVar10->fs[0],status_00);
    uVar5 = pfVar8->fs[0];
    if (iVar3 == 0) goto LAB_006d4e3d;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar4 = uVar5;
  }
  else {
LAB_006d4e3d:
    fVar4 = pfVar10->fs[0];
    if ((fVar4 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar5,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar5 = pfVar10->fs[0];
        fVar4 = uVar5;
        goto LAB_006d4fea;
      }
      uVar5 = pfVar8->fs[0];
      fVar4 = pfVar10->fs[0];
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_006d4fea:
  fVar4 = float32_max_mips(uVar5,fVar4,status_00);
  uVar5 = update_msacsr(env,0,0);
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  if ((uVar5 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4),status_00);
    uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    if (iVar3 == 0) goto LAB_006d506a;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar2 = uVar5;
  }
  else {
LAB_006d506a:
    uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    if ((uVar2 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar5,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
        uVar2 = uVar5;
        goto LAB_006d50a5;
      }
      uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
      uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_006d50a5:
  fVar6 = float32_max_mips(uVar5,uVar2,status_00);
  uVar5 = update_msacsr(env,0,0);
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar6 = float32_default_nan_mips(status_00);
    fVar6 = fVar6 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  if ((uVar5 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),status_00);
    uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    if (iVar3 == 0) goto LAB_006d5123;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar2 = uVar5;
  }
  else {
LAB_006d5123:
    uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if ((uVar2 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar5,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
        uVar2 = uVar5;
        goto LAB_006d5161;
      }
      uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_006d5161:
  fVar7 = float32_max_mips(uVar5,uVar2,status_00);
  uVar5 = update_msacsr(env,0,0);
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar7 = float32_default_nan_mips(status_00);
    fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  fVar12 = CONCAT44(fVar6,fVar4);
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  if ((uVar5 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc),status_00)
    ;
    uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    if (iVar3 == 0) goto LAB_006d51e6;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar2 = uVar5;
  }
  else {
LAB_006d51e6:
    uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    if ((uVar2 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar5,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
        uVar2 = uVar5;
        goto LAB_006d5224;
      }
      uVar5 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
      uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_006d5224:
  fVar4 = float32_max_mips(uVar5,uVar2,status_00);
  uVar5 = update_msacsr(env,0,0);
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  fVar11 = CONCAT44(fVar4,fVar7);
LAB_006d5273:
  check_msacsr_cause(env,unaff_retaddr);
  (env->active_fpu).fpr[wd].fd = fVar12;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar11;
  return;
}

Assistant:

void helper_msa_fmax_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
     float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {

        if (NUMBER_QNAN_PAIR(pws->w[0], pwt->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pws->w[0], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[0], pws->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pwt->w[0], pwt->w[0], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pwt->w[0], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[1], pwt->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pws->w[1], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[1], pws->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pwt->w[1], pwt->w[1], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pwt->w[1], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[2], pwt->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pws->w[2], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[2], pws->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pwt->w[2], pwt->w[2], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pwt->w[2], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[3], pwt->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pws->w[3], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[3], pws->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pwt->w[3], pwt->w[3], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pwt->w[3], 32);
        }

    } else if (df == DF_DOUBLE) {

        if (NUMBER_QNAN_PAIR(pws->d[0], pwt->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pws->d[0], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[0], pws->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pwt->d[0], pwt->d[0], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pwt->d[0], 64);
        }

        if (NUMBER_QNAN_PAIR(pws->d[1], pwt->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pws->d[1], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[1], pws->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pwt->d[1], pwt->d[1], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pwt->d[1], 64);
        }

    } else {

        assert(0);

    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}